

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

_Bool bitset_grow(bitset_t *bitset,size_t newarraysize)

{
  long lVar1;
  ulong uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  
  uVar4 = bitset->arraysize;
  if (newarraysize >> 0x3a != 0 || newarraysize < uVar4) {
    return false;
  }
  if (bitset->capacity < newarraysize) {
    lVar1 = 0x3f;
    if (newarraysize != 0) {
      for (; newarraysize >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar4 = (0xffffffffffffffffU >> (~(byte)lVar1 & 0x3f)) + 1;
    do {
      uVar2 = uVar4;
      uVar4 = uVar2 * 2;
    } while (uVar2 < newarraysize);
    puVar3 = (uint64_t *)roaring_realloc(bitset->array,uVar2 * 8);
    if (puVar3 == (uint64_t *)0x0) {
      return false;
    }
    bitset->capacity = uVar2;
    bitset->array = puVar3;
    uVar4 = bitset->arraysize;
  }
  else {
    puVar3 = bitset->array;
  }
  memset(puVar3 + uVar4,0,(newarraysize - uVar4) * 8);
  bitset->arraysize = newarraysize;
  return true;
}

Assistant:

bool bitset_grow(bitset_t *bitset, size_t newarraysize) {
    if (newarraysize < bitset->arraysize) {
        return false;
    }
    if (newarraysize > SIZE_MAX / 64) {
        return false;
    }
    if (bitset->capacity < newarraysize) {
        uint64_t *newarray;
        size_t newcapacity = (UINT64_C(0xFFFFFFFFFFFFFFFF) >>
                              roaring_leading_zeroes(newarraysize)) +
                             1;
        while (newcapacity < newarraysize) {
            newcapacity *= 2;
        }
        if ((newarray = (uint64_t *)roaring_realloc(
                 bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
            return false;
        }
        bitset->capacity = newcapacity;
        bitset->array = newarray;
    }
    memset(bitset->array + bitset->arraysize, 0,
           sizeof(uint64_t) * (newarraysize - bitset->arraysize));
    bitset->arraysize = newarraysize;
    return true;  // success!
}